

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O1

void deqp::egl::Image::imageTargetRenderbuffer(Library *egl,Functions *gl,GLeglImageOES img)

{
  GLenum err;
  deUint32 err_00;
  NotSupportedError *this;
  
  (*gl->eglImageTargetRenderbufferStorageOES)(0x8d41,img);
  err = (*gl->getError)();
  if (err != 0x502) {
    glu::checkError(err,"glEGLImageTargetRenderbufferStorageOES()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x160);
    err_00 = (*egl->_vptr_Library[0x1f])(egl);
    eglu::checkError(err_00,"glEGLImageTargetRenderbufferStorageOES()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                     ,0x161);
    return;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,"Creating renderbuffer from EGLImage type not supported",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
             ,0x15e);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

static void imageTargetRenderbuffer (const Library& egl, const glw::Functions& gl, GLeglImageOES img)
{
	gl.eglImageTargetRenderbufferStorageOES(GL_RENDERBUFFER, img);
	{
		const GLenum error = gl.getError();

		if (error == GL_INVALID_OPERATION)
			TCU_THROW(NotSupportedError, "Creating renderbuffer from EGLImage type not supported");

		GLU_EXPECT_NO_ERROR(error, "glEGLImageTargetRenderbufferStorageOES()");
		EGLU_CHECK_MSG(egl, "glEGLImageTargetRenderbufferStorageOES()");
	}
}